

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotBarsHEx<ImPlot::GetterXsYs<double>,double>
               (char *label_id,GetterXsYs<double> *getter,double height)

{
  ImPlotNextItemData *col;
  ImVec2 IVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  ImPlotContext *pIVar5;
  bool bVar6;
  ImU32 col_00;
  ImU32 col_01;
  long lVar7;
  ImDrawList *this;
  int iVar8;
  int iVar9;
  double dVar10;
  ImVec2 a;
  ImVec2 b;
  ImPlotPoint local_48;
  ImVec2 local_38;
  
  bVar6 = BeginItem(label_id,1);
  if (bVar6) {
    dVar10 = height * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar8 = getter->Count, 0 < iVar8)) {
      iVar9 = 0;
      do {
        lVar7 = (long)(((getter->Offset + iVar9) % iVar8 + iVar8) % iVar8) * (long)getter->Stride;
        IVar1 = *(ImVec2 *)((long)getter->Xs + lVar7);
        dVar2 = *(double *)((long)getter->Ys + lVar7);
        local_48.y = dVar2 - dVar10;
        local_48.x = 0.0;
        FitPoint(&local_48);
        local_48.y = dVar2 + dVar10;
        local_48.x = (double)IVar1;
        FitPoint(&local_48);
        iVar9 = iVar9 + 1;
        iVar8 = getter->Count;
      } while (iVar9 < iVar8);
    }
    pIVar5 = GImPlot;
    col = &GImPlot->NextItemData;
    this = GetPlotDrawList();
    col_00 = ImGui::GetColorU32(col->Colors);
    col_01 = ImGui::GetColorU32((pIVar5->NextItemData).Colors + 1);
    iVar8 = getter->Count;
    if (0 < iVar8) {
      bVar6 = (pIVar5->NextItemData).RenderFill;
      bVar4 = (pIVar5->NextItemData).RenderLine;
      iVar9 = 0;
      do {
        lVar7 = (long)(((getter->Offset + iVar9) % iVar8 + iVar8) % iVar8) * (long)getter->Stride;
        dVar2 = *(double *)((long)getter->Xs + lVar7);
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          dVar3 = *(double *)((long)getter->Ys + lVar7);
          local_48.x = (double)PlotToPixels(0.0,dVar3 - dVar10,-1);
          local_38 = PlotToPixels(dVar2,dVar3 + dVar10,-1);
          if ((pIVar5->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,(ImVec2 *)&local_48,&local_38,col_01,0.0,0xf);
          }
          if (((bVar6 ^ 1U | col_00 != col_01) & bVar4) != 0) {
            ImDrawList::AddRect(this,(ImVec2 *)&local_48,&local_38,col_00,0.0,0xf,
                                (pIVar5->NextItemData).LineWeight);
          }
          iVar8 = getter->Count;
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 < iVar8);
    }
    pIVar5 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar5->NextItemData);
    pIVar5->PreviousItem = pIVar5->CurrentItem;
    pIVar5->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsHEx(const char* label_id, const Getter& getter, THeight height) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const THeight half_height = height / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(0, p.y - half_height));
                FitPoint(ImPlotPoint(p.x, p.y + half_height));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.x == 0)
                continue;
            ImVec2 a = PlotToPixels(0, p.y - half_height);
            ImVec2 b = PlotToPixels(p.x, p.y + half_height);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawCornerFlags_All, s.LineWeight);
        }
        EndItem();
    }
}